

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O2

void Cmd_echo(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  char *in_RAX;
  char *pcVar2;
  int i;
  FString formatted;
  
  formatted.Chars = in_RAX;
  iVar1 = FCommandLine::argc(argv);
  for (i = 1; i < iVar1; i = i + 1) {
    FCommandLine::operator[](argv,i);
    strbin1((char *)&formatted);
    pcVar2 = " ";
    if (i + (2 - iVar1) == 1) {
      pcVar2 = "\n";
    }
    Printf("%s%s",formatted.Chars,pcVar2);
    FString::~FString(&formatted);
  }
  return;
}

Assistant:

CCMD (echo)
{
	int last = argv.argc()-1;
	for (int i = 1; i <= last; ++i)
	{
		FString formatted = strbin1 (argv[i]);
		Printf ("%s%s", formatted.GetChars(), i!=last ? " " : "\n");
	}
}